

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CliffordLib.cpp
# Opt level: O1

void InitConformal(void)

{
  pointer pBVar1;
  pointer pBVar2;
  int iVar3;
  int a;
  long lVar4;
  pointer pBVar5;
  int b;
  long lVar6;
  int (*paiVar7) [512];
  vector<Blade,_std::allocator<Blade>_> local_d8;
  vector<Blade,_std::allocator<Blade>_> local_c0;
  vector<Blade,_std::allocator<Blade>_> local_a8;
  Clifford local_90;
  vector<Blade,_std::allocator<Blade>_> local_78;
  vector<Blade,_std::allocator<Blade>_> local_60;
  Clifford local_48;
  
  tp = 4;
  tq = 1;
  dim = 0x20;
  Re = (float *)operator_new__(0x80);
  paiVar7 = signs;
  lVar4 = 0;
  do {
    lVar6 = 0;
    do {
      iVar3 = sign2((int)lVar4,(int)lVar6);
      (*paiVar7)[lVar6] = iVar3;
      pBVar2 = e0.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
               _M_finish;
      pBVar1 = e0.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
               _M_start;
      lVar6 = lVar6 + 1;
    } while (lVar6 != 0x20);
    lVar4 = lVar4 + 1;
    paiVar7 = paiVar7 + 1;
  } while (lVar4 != 0x20);
  pBVar5 = e0.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
           _M_start;
  if (e0.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data._M_finish
      != e0.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
         _M_start) {
    do {
      Blade::~Blade(pBVar5);
      pBVar5 = pBVar5 + 1;
    } while (pBVar5 != pBVar2);
    e0.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data._M_finish =
         pBVar1;
  }
  pBVar2 = e1.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
           _M_finish;
  pBVar1 = e1.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
           _M_start;
  pBVar5 = e1.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
           _M_start;
  if (e1.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data._M_finish
      != e1.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
         _M_start) {
    do {
      Blade::~Blade(pBVar5);
      pBVar5 = pBVar5 + 1;
    } while (pBVar5 != pBVar2);
    e1.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data._M_finish =
         pBVar1;
  }
  pBVar2 = e2.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
           _M_finish;
  pBVar1 = e2.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
           _M_start;
  pBVar5 = e2.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
           _M_start;
  if (e2.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data._M_finish
      != e2.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
         _M_start) {
    do {
      Blade::~Blade(pBVar5);
      pBVar5 = pBVar5 + 1;
    } while (pBVar5 != pBVar2);
    e2.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data._M_finish =
         pBVar1;
  }
  pBVar2 = e3.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
           _M_finish;
  pBVar1 = e3.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
           _M_start;
  pBVar5 = e3.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
           _M_start;
  if (e3.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data._M_finish
      != e3.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
         _M_start) {
    do {
      Blade::~Blade(pBVar5);
      pBVar5 = pBVar5 + 1;
    } while (pBVar5 != pBVar2);
    e3.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data._M_finish =
         pBVar1;
  }
  pBVar2 = e4.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
           _M_finish;
  pBVar1 = e4.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
           _M_start;
  pBVar5 = e4.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
           _M_start;
  if (e4.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data._M_finish
      != e4.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
         _M_start) {
    do {
      Blade::~Blade(pBVar5);
      pBVar5 = pBVar5 + 1;
    } while (pBVar5 != pBVar2);
    e4.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data._M_finish =
         pBVar1;
  }
  pBVar2 = Ie.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
           _M_finish;
  pBVar1 = Ie.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
           _M_start;
  pBVar5 = Ie.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
           _M_start;
  if (Ie.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data._M_finish
      != Ie.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
         _M_start) {
    do {
      Blade::~Blade(pBVar5);
      pBVar5 = pBVar5 + 1;
    } while (pBVar5 != pBVar2);
    Ie.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data._M_finish =
         pBVar1;
  }
  pBVar2 = E.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
           _M_finish;
  pBVar1 = E.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
           _M_start;
  pBVar5 = E.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
           _M_start;
  if (E.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data._M_finish
      != E.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
         _M_start) {
    do {
      Blade::~Blade(pBVar5);
      pBVar5 = pBVar5 + 1;
    } while (pBVar5 != pBVar2);
    E.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data._M_finish =
         pBVar1;
  }
  pBVar2 = Ic.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
           _M_finish;
  pBVar1 = Ic.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
           _M_start;
  pBVar5 = Ic.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
           _M_start;
  if (Ic.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data._M_finish
      != Ic.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
         _M_start) {
    do {
      Blade::~Blade(pBVar5);
      pBVar5 = pBVar5 + 1;
    } while (pBVar5 != pBVar2);
    Ic.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data._M_finish =
         pBVar1;
  }
  pBVar1 = e0.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
           _M_start;
  Blade::Blade((Blade *)&local_d8,0);
  std::vector<Blade,_std::allocator<Blade>_>::_M_insert_rval
            (&e0,(const_iterator)pBVar1,(value_type *)&local_d8);
  Blade::~Blade((Blade *)&local_d8);
  pBVar1 = e1.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
           _M_start;
  Blade::Blade((Blade *)&local_d8,1);
  std::vector<Blade,_std::allocator<Blade>_>::_M_insert_rval
            (&e1,(const_iterator)pBVar1,(value_type *)&local_d8);
  Blade::~Blade((Blade *)&local_d8);
  pBVar1 = e2.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
           _M_start;
  Blade::Blade((Blade *)&local_d8,2);
  std::vector<Blade,_std::allocator<Blade>_>::_M_insert_rval
            (&e2,(const_iterator)pBVar1,(value_type *)&local_d8);
  Blade::~Blade((Blade *)&local_d8);
  pBVar1 = e3.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
           _M_start;
  Blade::Blade((Blade *)&local_d8,4);
  std::vector<Blade,_std::allocator<Blade>_>::_M_insert_rval
            (&e3,(const_iterator)pBVar1,(value_type *)&local_d8);
  Blade::~Blade((Blade *)&local_d8);
  pBVar1 = e4.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
           _M_start;
  Blade::Blade((Blade *)&local_d8,8);
  std::vector<Blade,_std::allocator<Blade>_>::_M_insert_rval
            (&e4,(const_iterator)pBVar1,(value_type *)&local_d8);
  Blade::~Blade((Blade *)&local_d8);
  pBVar1 = e5.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
           _M_start;
  Blade::Blade((Blade *)&local_d8,0x10);
  std::vector<Blade,_std::allocator<Blade>_>::_M_insert_rval
            (&e5,(const_iterator)pBVar1,(value_type *)&local_d8);
  Blade::~Blade((Blade *)&local_d8);
  pBVar1 = Ie.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
           _M_start;
  Blade::Blade((Blade *)&local_d8,7);
  std::vector<Blade,_std::allocator<Blade>_>::_M_insert_rval
            (&Ie,(const_iterator)pBVar1,(value_type *)&local_d8);
  Blade::~Blade((Blade *)&local_d8);
  pBVar1 = E.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
           _M_start;
  Blade::Blade((Blade *)&local_d8,0x18);
  std::vector<Blade,_std::allocator<Blade>_>::_M_insert_rval
            (&E,(const_iterator)pBVar1,(value_type *)&local_d8);
  Blade::~Blade((Blade *)&local_d8);
  pBVar1 = Ic.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
           _M_start;
  Blade::Blade((Blade *)&local_d8,0x1f);
  std::vector<Blade,_std::allocator<Blade>_>::_M_insert_rval
            (&Ic,(const_iterator)pBVar1,(value_type *)&local_d8);
  Blade::~Blade((Blade *)&local_d8);
  std::vector<Blade,_std::allocator<Blade>_>::vector(&local_60,&e4);
  std::vector<Blade,_std::allocator<Blade>_>::vector(&local_78,&e5);
  operator+(&local_48,&local_60,&local_78);
  local_d8.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       e.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
       _M_end_of_storage;
  local_d8.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
  _M_finish = e.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
              _M_finish;
  local_d8.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
  _M_start = e.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
             _M_start;
  e.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data._M_start =
       local_48.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
       _M_start;
  e.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data._M_finish =
       local_48.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
       _M_finish;
  e.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       local_48.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
       _M_end_of_storage;
  local_48.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_48.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_48.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_d8);
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_48);
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_78);
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_60);
  std::vector<Blade,_std::allocator<Blade>_>::vector(&local_a8,&e5);
  std::vector<Blade,_std::allocator<Blade>_>::vector(&local_c0,&e4);
  operator-(&local_90,&local_a8,&local_c0);
  operator/(&local_48,&local_90,2.0);
  local_d8.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       eo.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
       _M_end_of_storage;
  local_d8.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
  _M_finish = eo.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
              _M_finish;
  local_d8.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
  _M_start = eo.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
             _M_start;
  eo.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data._M_start =
       local_48.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
       _M_start;
  eo.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data._M_finish =
       local_48.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
       _M_finish;
  eo.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       local_48.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
       _M_end_of_storage;
  local_48.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_48.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_48.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_d8);
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_48);
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_90);
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_c0);
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_a8);
  return;
}

Assistant:

void InitConformal()
{
	//dimention of algebra
	tp=4; tq=1;dim=(1<<(tp+tq));
	Re=new float[dim];

	for(int a=0;a<dim;a++)
	{
		for(int b=0;b<dim;b++)
		{
			signs[a][b]=sign2(a,b);	
		}
		
	}
	//init basis
	e0.clear();
	e1.clear();
	e2.clear();
	e3.clear();
	e4.clear();
	Ie.clear();
	 E.clear();
	Ic.clear();
	e0.insert(e0.begin(),Blade(0));
	e1.insert(e1.begin(),Blade(1));
	e2.insert(e2.begin(),Blade(2));
	e3.insert(e3.begin(),Blade(4));
	e4.insert(e4.begin(),Blade(8));
	e5.insert(e5.begin(),Blade(16));
	Ie.insert(Ie.begin(),Blade(7));
	 E.insert( E.begin(),Blade(24));
	Ic.insert(Ic.begin(),Blade(31));
	
	e=e4+e5;
	eo=(e5-e4)/2.0;



}